

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O0

void __thiscall unodb::detail::deferred_requests::~deferred_requests(deferred_requests *this)

{
  bool bVar1;
  reference this_00;
  deallocation_request *dealloc_request;
  const_iterator __end2;
  const_iterator __begin2;
  dealloc_request_vector *__range2;
  deferred_requests *this_local;
  
  __end2 = std::
           vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ::begin(&this->requests);
  dealloc_request =
       (deallocation_request *)
       std::
       vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
       ::end(&this->requests);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_unodb::detail::deallocation_request_*,_std::vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>_>
                      (&__end2,(__normal_iterator<const_unodb::detail::deallocation_request_*,_std::vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>_>
                                *)&dealloc_request);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_unodb::detail::deallocation_request_*,_std::vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>_>
              ::operator*(&__end2);
    deallocation_request::deallocate
              (this_00,(bool)(this->orphaned_requests & 1),
               (optional<unodb::detail::qsbr_epoch>)
               (this->dealloc_epoch).super__Optional_base<unodb::detail::qsbr_epoch,_true,_true>.
               _M_payload.super__Optional_payload_base<unodb::detail::qsbr_epoch>,
               (optional<bool>)
               (this->dealloc_epoch_single_thread_mode).super__Optional_base<bool,_true,_true>.
               _M_payload.super__Optional_payload_base<bool>);
    __gnu_cxx::
    __normal_iterator<const_unodb::detail::deallocation_request_*,_std::vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ::~vector(&this->requests);
  return;
}

Assistant:

~deferred_requests() noexcept {
    for (const auto &dealloc_request : requests) {
      dealloc_request.deallocate(
#ifndef NDEBUG
          orphaned_requests, dealloc_epoch, dealloc_epoch_single_thread_mode
#endif
      );
    }
  }